

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O0

bool __thiscall
cmCMakePresetsGraphInternal::AnyAllOfCondition::Evaluate
          (AnyAllOfCondition *this,MacroExpanderVector *expanders,int version,optional<bool> *out)

{
  bool bVar1;
  __optional_eq_t<bool,_bool> _Var2;
  uint uVar3;
  pointer pCVar4;
  bool local_55;
  _Optional_payload_base<bool> local_54;
  _Optional_payload_base<bool> local_52;
  reference puStack_50;
  optional<bool> result;
  unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
  *condition;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>_>_>
  *__range1;
  optional<bool> *out_local;
  int version_local;
  MacroExpanderVector *expanders_local;
  AnyAllOfCondition *this_local;
  
  __end1 = std::
           vector<std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>_>_>
           ::begin(&this->Conditions);
  condition = (unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
               *)std::
                 vector<std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>_>_>
                 ::end(&this->Conditions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>_*,_std::vector<std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>_>_>_>
                                *)&condition);
    if (!bVar1) {
      local_55 = (bool)((this->StopValue ^ 0xffU) & 1);
      std::optional<bool>::optional<bool,_true>((optional<bool> *)&local_54,&local_55);
      (out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool> =
           local_54;
      return true;
    }
    puStack_50 = __gnu_cxx::
                 __normal_iterator<const_std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>_*,_std::vector<std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>_>_>_>
                 ::operator*(&__end1);
    std::optional<bool>::optional((optional<bool> *)&local_52);
    pCVar4 = std::
             unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
             ::operator->(puStack_50);
    uVar3 = (*pCVar4->_vptr_Condition[2])(pCVar4,expanders,(ulong)(uint)version,&local_52);
    if ((uVar3 & 1) == 0) {
      std::optional<bool>::reset(out);
      return false;
    }
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_52);
    if (!bVar1) {
      std::optional<bool>::reset(out);
      return true;
    }
    _Var2 = std::operator==((optional<bool> *)&local_52,&this->StopValue);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>_*,_std::vector<std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>_>_>_>
    ::operator++(&__end1);
  }
  (out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool> =
       local_52;
  return true;
}

Assistant:

bool cmCMakePresetsGraphInternal::AnyAllOfCondition::Evaluate(
  MacroExpanderVector const& expanders, int version,
  cm::optional<bool>& out) const
{
  for (auto const& condition : this->Conditions) {
    cm::optional<bool> result;
    if (!condition->Evaluate(expanders, version, result)) {
      out.reset();
      return false;
    }

    if (!result) {
      out.reset();
      return true;
    }

    if (result == this->StopValue) {
      out = result;
      return true;
    }
  }

  out = !this->StopValue;
  return true;
}